

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlwaysCombNonBlocking.cpp
# Opt level: O0

void __thiscall
always_comb_non_blocking::MainVisitor::handle(MainVisitor *this,ProceduralBlockSymbol *symbol)

{
  bool bVar1;
  ProceduralBlockSymbol *in_RSI;
  SourceManager *in_stack_00000028;
  SourceLocation in_stack_00000030;
  bool hasNonBlockingAssignment;
  TidyVisitor *in_stack_00000120;
  undefined1 in_stack_00000128 [16];
  anon_class_8_1_05aec793 in_stack_ffffffffffffff98;
  
  slang::not_null<const_slang::SourceManager_*>::operator->
            ((not_null<const_slang::SourceManager_*> *)0x241a6d);
  slang::SourceManager::getFileName(in_stack_00000028,in_stack_00000030);
  bVar1 = TidyVisitor::skip(in_stack_00000120,(string_view)in_stack_00000128);
  if ((!bVar1) && (in_RSI->procedureKind == AlwaysComb)) {
    slang::ast::
    makeVisitor<always_comb_non_blocking::MainVisitor::handle(slang::ast::ProceduralBlockSymbol_const&)::_lambda(auto:1&,slang::ast::AssignmentExpression_const&)_1_>
              (in_stack_ffffffffffffff98);
    slang::ast::ProceduralBlockSymbol::
    visitStmts<slang::ast::makeVisitor<always_comb_non_blocking::MainVisitor::handle(slang::ast::ProceduralBlockSymbol_const&)::_lambda(auto:1&,slang::ast::AssignmentExpression_const&)_1_>(always_comb_non_blocking::MainVisitor::handle(slang::ast::ProceduralBlockSymbol_const&)::_lambda(auto:1&,slang::ast::AssignmentExpression_const&)_1_)::Result>
              (in_RSI,(Result *)in_stack_ffffffffffffff98.hasNonBlockingAssignment);
  }
  return;
}

Assistant:

void handle(const ProceduralBlockSymbol& symbol) {
        NEEDS_SKIP_SYMBOL(symbol)
        if (symbol.procedureKind == ProceduralBlockKind::AlwaysComb) {
            bool hasNonBlockingAssignment = false;
            symbol.visitStmts(makeVisitor([&](auto&, const AssignmentExpression& expr) {
                if (expr.isNonBlocking()) {
                    hasNonBlockingAssignment = true;
                }
            }));
            if (hasNonBlockingAssignment) {
                diags.add(diag::AlwaysCombNonBlocking, symbol.location);
            }
        }
    }